

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLcode protocol_connecting(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  pcVar1 = data->conn;
  if ((pcVar1 == (connectdata *)0x0) ||
     (pcVar1->handler->connecting == (_func_CURLcode_Curl_easy_ptr__Bool_ptr *)0x0)) {
    *done = true;
  }
  else {
    *done = false;
    conn._4_4_ = (*pcVar1->handler->connecting)(data,done);
  }
  return conn._4_4_;
}

Assistant:

static CURLcode protocol_connecting(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  if(conn && conn->handler->connecting) {
    *done = FALSE;
    result = conn->handler->connecting(data, done);
  }
  else
    *done = TRUE;

  return result;
}